

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

bool ImGui_ImplSDL2_Init(SDL_Window *window,SDL_Renderer *renderer,void *sdl_gl_context)

{
  char *__s;
  undefined1 uVar1;
  int iVar2;
  ImGuiIO *pIVar3;
  char *__s1;
  size_t __n;
  undefined8 *__s_00;
  undefined8 uVar4;
  ImGuiViewport *pIVar5;
  long lVar6;
  SDL_SysWMinfo info;
  
  pIVar3 = ImGui::GetIO();
  ImGui::DebugCheckVersionAndDataLayout("1.91.0",0x38f8,0x484,8,0x10,0x14,4);
  __s1 = (char *)SDL_GetCurrentVideoDriver();
  uVar1 = 0;
  for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 8) {
    __s = *(char **)((long)&PTR_anon_var_dwarf_2dcda1_00203cb0 + lVar6);
    __n = strlen(__s);
    iVar2 = strncmp(__s1,__s,__n);
    if (iVar2 == 0) {
      uVar1 = 1;
    }
  }
  __s_00 = (undefined8 *)ImGui::MemAlloc(0x98);
  memset(__s_00,0,0x98);
  pIVar3->BackendPlatformUserData = __s_00;
  pIVar3->BackendPlatformName = "imgui_impl_sdl2";
  *(byte *)&pIVar3->BackendFlags = (byte)pIVar3->BackendFlags | 6;
  *__s_00 = window;
  __s_00[1] = renderer;
  *(undefined1 *)((long)__s_00 + 0x7c) = uVar1;
  pIVar3->SetClipboardTextFn = ImGui_ImplSDL2_SetClipboardText;
  pIVar3->GetClipboardTextFn = ImGui_ImplSDL2_GetClipboardText;
  pIVar3->ClipboardUserData = (void *)0x0;
  pIVar3->PlatformSetImeDataFn = ImGui_ImplSDL2_PlatformSetImeData;
  *(undefined1 *)((long)__s_00 + 0x94) = 1;
  uVar4 = SDL_CreateSystemCursor(0);
  __s_00[5] = uVar4;
  uVar4 = SDL_CreateSystemCursor(1);
  __s_00[6] = uVar4;
  uVar4 = SDL_CreateSystemCursor(9);
  __s_00[7] = uVar4;
  uVar4 = SDL_CreateSystemCursor(8);
  __s_00[8] = uVar4;
  uVar4 = SDL_CreateSystemCursor(7);
  __s_00[9] = uVar4;
  uVar4 = SDL_CreateSystemCursor(6);
  __s_00[10] = uVar4;
  uVar4 = SDL_CreateSystemCursor(5);
  __s_00[0xb] = uVar4;
  uVar4 = SDL_CreateSystemCursor(0xb);
  __s_00[0xc] = uVar4;
  uVar4 = SDL_CreateSystemCursor(10);
  __s_00[0xd] = uVar4;
  pIVar5 = ImGui::GetMainViewport();
  pIVar5->PlatformHandle = window;
  pIVar5->PlatformHandleRaw = (void *)0x0;
  SDL_GetWindowWMInfo(window);
  SDL_SetHint("SDL_MOUSE_FOCUS_CLICKTHROUGH","1");
  uVar1 = SDL_SetHint("SDL_IME_SHOW_UI","1");
  return (bool)uVar1;
}

Assistant:

static bool ImGui_ImplSDL2_Init(SDL_Window* window, SDL_Renderer* renderer, void* sdl_gl_context)
{
    ImGuiIO& io = ImGui::GetIO();
    IMGUI_CHECKVERSION();
    IM_ASSERT(io.BackendPlatformUserData == nullptr && "Already initialized a platform backend!");

    // Check and store if we are on a SDL backend that supports global mouse position
    // ("wayland" and "rpi" don't support it, but we chose to use a white-list instead of a black-list)
    bool mouse_can_use_global_state = false;
#if SDL_HAS_CAPTURE_AND_GLOBAL_MOUSE
    const char* sdl_backend = SDL_GetCurrentVideoDriver();
    const char* global_mouse_whitelist[] = { "windows", "cocoa", "x11", "DIVE", "VMAN" };
    for (int n = 0; n < IM_ARRAYSIZE(global_mouse_whitelist); n++)
        if (strncmp(sdl_backend, global_mouse_whitelist[n], strlen(global_mouse_whitelist[n])) == 0)
            mouse_can_use_global_state = true;
#endif

    // Setup backend capabilities flags
    ImGui_ImplSDL2_Data* bd = IM_NEW(ImGui_ImplSDL2_Data)();
    io.BackendPlatformUserData = (void*)bd;
    io.BackendPlatformName = "imgui_impl_sdl2";
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;       // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;        // We can honor io.WantSetMousePos requests (optional, rarely used)

    bd->Window = window;
    bd->Renderer = renderer;
    bd->MouseCanUseGlobalState = mouse_can_use_global_state;

    io.SetClipboardTextFn = ImGui_ImplSDL2_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplSDL2_GetClipboardText;
    io.ClipboardUserData = nullptr;
    io.PlatformSetImeDataFn = ImGui_ImplSDL2_PlatformSetImeData;
#ifdef __EMSCRIPTEN__
    io.PlatformOpenInShellFn = [](ImGuiContext*, const char* url) { ImGui_ImplSDL2_EmscriptenOpenURL(url); return true; };
#endif

    // Gamepad handling
    bd->GamepadMode = ImGui_ImplSDL2_GamepadMode_AutoFirst;
    bd->WantUpdateGamepadsList = true;

    // Load mouse cursors
    bd->MouseCursors[ImGuiMouseCursor_Arrow] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_ARROW);
    bd->MouseCursors[ImGuiMouseCursor_TextInput] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_IBEAM);
    bd->MouseCursors[ImGuiMouseCursor_ResizeAll] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZEALL);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNS] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENS);
    bd->MouseCursors[ImGuiMouseCursor_ResizeEW] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZEWE);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNESW] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENESW);
    bd->MouseCursors[ImGuiMouseCursor_ResizeNWSE] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENWSE);
    bd->MouseCursors[ImGuiMouseCursor_Hand] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_HAND);
    bd->MouseCursors[ImGuiMouseCursor_NotAllowed] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_NO);

    // Set platform dependent data in viewport
    // Our mouse update function expect PlatformHandle to be filled for the main viewport
    ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    main_viewport->PlatformHandle = (void*)window;
    main_viewport->PlatformHandleRaw = nullptr;
    SDL_SysWMinfo info;
    SDL_VERSION(&info.version);
    if (SDL_GetWindowWMInfo(window, &info))
    {
#if defined(SDL_VIDEO_DRIVER_WINDOWS)
        main_viewport->PlatformHandleRaw = (void*)info.info.win.window;
#elif defined(__APPLE__) && defined(SDL_VIDEO_DRIVER_COCOA)
        main_viewport->PlatformHandleRaw = (void*)info.info.cocoa.window;
#endif
    }

    // From 2.0.5: Set SDL hint to receive mouse click events on window focus, otherwise SDL doesn't emit the event.
    // Without this, when clicking to gain focus, our widgets wouldn't activate even though they showed as hovered.
    // (This is unfortunately a global SDL setting, so enabling it might have a side-effect on your application.
    // It is unlikely to make a difference, but if your app absolutely needs to ignore the initial on-focus click:
    // you can ignore SDL_MOUSEBUTTONDOWN events coming right after a SDL_WINDOWEVENT_FOCUS_GAINED)
#ifdef SDL_HINT_MOUSE_FOCUS_CLICKTHROUGH
    SDL_SetHint(SDL_HINT_MOUSE_FOCUS_CLICKTHROUGH, "1");
#endif

    // From 2.0.18: Enable native IME.
    // IMPORTANT: This is used at the time of SDL_CreateWindow() so this will only affects secondary windows, if any.
    // For the main window to be affected, your application needs to call this manually before calling SDL_CreateWindow().
#ifdef SDL_HINT_IME_SHOW_UI
    SDL_SetHint(SDL_HINT_IME_SHOW_UI, "1");
#endif

    // From 2.0.22: Disable auto-capture, this is preventing drag and drop across multiple windows (see #5710)
#ifdef SDL_HINT_MOUSE_AUTO_CAPTURE
    SDL_SetHint(SDL_HINT_MOUSE_AUTO_CAPTURE, "0");
#endif

    (void)sdl_gl_context; // Unused in 'master' branch.
    return true;
}